

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O1

Group * __thiscall r_exec::Group::get_secondary_group(Group *this)

{
  long lVar1;
  Code *pCVar2;
  short sVar3;
  undefined2 uVar4;
  Group *pGVar5;
  Group *pGVar6;
  
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[0x13])();
  lVar1 = (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.markers.used_cells_head;
  pGVar6 = (Group *)0x0;
  do {
    if (lVar1 == -1) {
LAB_0016e8d9:
      (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
        super_Code.super__Object._vptr__Object[0x14])(this);
      return pGVar6;
    }
    pCVar2 = (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
             super_Code.markers.cells.
             super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar1].data;
    (**(code **)((long)(pCVar2->super__Object)._vptr__Object + 0x20))(pCVar2,0);
    sVar3 = r_code::Atom::asOpcode();
    if (sVar3 == Opcodes::MkGrpPair) {
      pCVar2 = (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
               super_Code.markers.cells.
               super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar1].data;
      (**(code **)((long)(pCVar2->super__Object)._vptr__Object + 0x20))(pCVar2,1);
      r_code::Atom::asIndex();
      pGVar5 = (Group *)(**(code **)((long)(pCVar2->super__Object)._vptr__Object + 0x48))(pCVar2);
      if (pGVar5 == this) {
        pCVar2 = (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                 super_Code.markers.cells.
                 super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar1].data;
        (**(code **)((long)(pCVar2->super__Object)._vptr__Object + 0x20))(pCVar2,2);
        uVar4 = r_code::Atom::asIndex();
        pGVar6 = (Group *)(**(code **)((long)(pCVar2->super__Object)._vptr__Object + 0x48))
                                    (pCVar2,uVar4);
        goto LAB_0016e8d9;
      }
    }
    lVar1 = (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.markers.cells.
            super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
            ._M_impl.super__Vector_impl_data._M_start[lVar1].next;
  } while( true );
}

Assistant:

Group *Group::get_secondary_group()
{
    Group *secondary = nullptr;
    r_code::list<Code *>::const_iterator m;
    acq_markers();

    for (m = markers.begin(); m != markers.end(); ++m) {
        if ((*m)->code(0).asOpcode() == Opcodes::MkGrpPair) {
            if ((Group *)(*m)->get_reference((*m)->code(GRP_PAIR_FIRST).asIndex()) == this) {
                secondary = (Group *)(*m)->get_reference((*m)->code(GRP_PAIR_SECOND).asIndex());
                break;
            }
        }
    }

    rel_markers();
    return secondary;
}